

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmap.c
# Opt level: O0

void remove_rooms(level *lev,int lx,int ly,int hx,int hy)

{
  mkroom *pmVar1;
  mkroom *croom;
  int i;
  int hy_local;
  int hx_local;
  int ly_local;
  int lx_local;
  level *lev_local;
  
  croom._4_4_ = lev->nroom;
  while (croom._4_4_ = croom._4_4_ - 1, -1 < (int)croom._4_4_) {
    pmVar1 = lev->rooms + (int)croom._4_4_;
    if ((((lx <= pmVar1->hx) && (pmVar1->lx < hx)) && (ly <= pmVar1->hy)) && (pmVar1->ly < hy)) {
      if (((pmVar1->lx < lx) || (hx <= pmVar1->hx)) || ((pmVar1->ly < ly || (hy <= pmVar1->hy)))) {
        if (pmVar1->irregular == '\0') {
          impossible("regular room in joined map");
        }
      }
      else {
        remove_room(lev,croom._4_4_);
      }
    }
  }
  return;
}

Assistant:

void remove_rooms(struct level *lev, int lx, int ly, int hx, int hy)
{
    int i;
    struct mkroom *croom;

    for (i = lev->nroom - 1; i >= 0; --i) {
	croom = &lev->rooms[i];
	if (croom->hx < lx || croom->lx >= hx ||
	    croom->hy < ly || croom->ly >= hy) continue; /* no overlap */

	if (croom->lx < lx || croom->hx >= hx ||
	    croom->ly < ly || croom->hy >= hy) { /* partial overlap */
	    /* TODO: ensure remaining parts of room are still joined */

	    if (!croom->irregular) impossible("regular room in joined map");
	} else {
	    /* total overlap, remove the room */
	    remove_room(lev, (unsigned)i);
	}
    }
}